

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::QueryInterface(ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *this,INTERFACE_ID *IID,IObject **ppInterface)

{
  bool bVar1;
  
  if (ppInterface == (IObject **)0x0) {
    return;
  }
  *ppInterface = (IObject *)0x0;
  bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_ShaderResourceVariable);
  if ((!bVar1) &&
     (bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)Diligent::IID_Unknown), !bVar1)) {
    return;
  }
  *ppInterface = (IObject *)this;
  (*(this->super_IShaderResourceVariable).super_IObject._vptr_IObject[1])(this);
  return;
}

Assistant:

QueryInterface(const INTERFACE_ID& IID, IObject** ppInterface) override
    {
        if (ppInterface == nullptr)
            return;

        *ppInterface = nullptr;
        if (IID == IID_ShaderResourceVariable || IID == IID_Unknown)
        {
            *ppInterface = this;
            (*ppInterface)->AddRef();
        }
    }